

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_stats_striped_avx2_256_32.c
# Opt level: O2

parasail_result_t *
parasail_sw_stats_striped_profile_avx2_256_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  __m256i alVar1;
  __m256i alVar2;
  __m256i alVar3;
  __m256i alVar4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  int iVar8;
  parasail_matrix_t *ppVar9;
  void *pvVar10;
  void *pvVar11;
  void *pvVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  uint uVar19;
  __m256i c;
  __m256i c_00;
  __m256i c_01;
  __m256i c_02;
  undefined1 auVar20 [32];
  int iVar21;
  int iVar22;
  int iVar23;
  parasail_result_t *result;
  parasail_profile_t *profile_00;
  ulong uVar24;
  parasail_result_t *result_00;
  __m256i *b;
  __m256i *b_00;
  __m256i *b_01;
  __m256i *palVar25;
  __m256i *palVar26;
  __m256i *b_02;
  __m256i *b_03;
  __m256i *b_04;
  __m256i *b_05;
  __m256i *palVar27;
  __m256i *palVar28;
  __m256i *palVar29;
  ulong uVar30;
  char *pcVar31;
  uint uVar32;
  ulong uVar33;
  __m256i *palVar34;
  int iVar35;
  long lVar36;
  char *__format;
  __m256i *palVar37;
  long lVar38;
  int iVar39;
  int iVar40;
  __m256i *palVar41;
  __m256i *ptr;
  undefined1 auVar42 [16];
  undefined1 auVar45 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar46 [16];
  undefined1 auVar52 [16];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [64];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar61 [16];
  undefined1 auVar60 [32];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [32];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [32];
  undefined1 auVar70 [64];
  undefined1 in_ZMM13 [64];
  undefined1 auVar71 [64];
  __m256i *ptr_00;
  undefined4 in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda4;
  __m256i *local_248;
  __m256i *local_240;
  __m256i *local_238;
  __m256i *local_230;
  __m256i *local_228;
  __m256i *local_220;
  ulong local_210;
  undefined1 local_1b8 [32];
  undefined1 local_178 [32];
  undefined1 local_158 [32];
  
  auVar44 = in_ZMM13._0_32_;
  pcVar31 = profile->s1;
  ppVar9 = profile->matrix;
  result = parasail_sw_striped_profile_avx2_256_32(profile,s2,s2Len,open,gap);
  iVar21 = parasail_result_is_saturated(result);
  if (iVar21 != 0) {
    return result;
  }
  iVar21 = result->end_query;
  iVar8 = result->end_ref;
  profile_00 = parasail_profile_create_stats_avx_256_32(pcVar31,iVar21 + 1,ppVar9);
  if (profile_00 == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar31 = "profile";
  }
  else {
    pvVar10 = (profile_00->profile32).score;
    if (pvVar10 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar31 = "profile->profile32.score";
    }
    else {
      ppVar9 = profile_00->matrix;
      if (ppVar9 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar31 = "profile->matrix";
      }
      else {
        uVar24 = (ulong)(uint)profile_00->s1Len;
        if (profile_00->s1Len < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar31 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar31 = "s2";
        }
        else if (iVar8 < 0) {
          __format = "%s: %s must be > 0\n";
          pcVar31 = "s2Len";
        }
        else if (open < 0) {
          __format = "%s: %s must be >= 0\n";
          pcVar31 = "open";
        }
        else {
          if (-1 < gap) {
            pvVar11 = (profile_00->profile32).matches;
            pvVar12 = (profile_00->profile32).similar;
            iVar23 = ppVar9->max;
            result_00 = parasail_result_new_stats();
            if (result_00 == (parasail_result_t *)0x0) {
              result_00 = (parasail_result_t *)0x0;
            }
            else {
              uVar33 = uVar24 + 7 >> 3;
              result_00->flag = result_00->flag | 0x8410804;
              b = parasail_memalign___m256i(0x20,uVar33);
              local_238 = parasail_memalign___m256i(0x20,uVar33);
              b_00 = parasail_memalign___m256i(0x20,uVar33);
              local_240 = parasail_memalign___m256i(0x20,uVar33);
              b_01 = parasail_memalign___m256i(0x20,uVar33);
              local_248 = parasail_memalign___m256i(0x20,uVar33);
              palVar25 = parasail_memalign___m256i(0x20,uVar33);
              palVar26 = parasail_memalign___m256i(0x20,uVar33);
              b_02 = parasail_memalign___m256i(0x20,uVar33);
              b_03 = parasail_memalign___m256i(0x20,uVar33);
              b_04 = parasail_memalign___m256i(0x20,uVar33);
              b_05 = parasail_memalign___m256i(0x20,uVar33);
              palVar27 = parasail_memalign___m256i(0x20,uVar33);
              palVar28 = parasail_memalign___m256i(0x20,uVar33);
              local_228 = parasail_memalign___m256i(0x20,uVar33);
              palVar29 = parasail_memalign___m256i(0x20,uVar33);
              auVar59._8_8_ = 0;
              auVar59._0_8_ = b;
              auVar61._8_8_ = 0;
              auVar61._0_8_ = local_238;
              auVar59 = vpunpcklqdq_avx(auVar59,auVar61);
              auVar42._8_8_ = 0;
              auVar42._0_8_ = b_00;
              auVar45._8_8_ = 0;
              auVar45._0_8_ = local_240;
              auVar61 = vpunpcklqdq_avx(auVar42,auVar45);
              auVar42 = ZEXT116(0) * auVar61 + ZEXT116(1) * auVar59;
              auVar45 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar61;
              auVar46._8_8_ = 0;
              auVar46._0_8_ = b_01;
              auVar52._8_8_ = 0;
              auVar52._0_8_ = local_248;
              auVar59 = vpunpcklqdq_avx(auVar46,auVar52);
              auVar53._8_8_ = 0;
              auVar53._0_8_ = palVar25;
              auVar55._8_8_ = 0;
              auVar55._0_8_ = palVar26;
              auVar61 = vpunpcklqdq_avx(auVar53,auVar55);
              auVar46 = ZEXT116(0) * auVar61 + ZEXT116(1) * auVar59;
              auVar52 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar61;
              auVar54._8_8_ = 0;
              auVar54._0_8_ = b_02;
              auVar56._8_8_ = 0;
              auVar56._0_8_ = b_03;
              auVar59 = vpunpcklqdq_avx(auVar54,auVar56);
              auVar57._8_8_ = 0;
              auVar57._0_8_ = b_04;
              auVar62._8_8_ = 0;
              auVar62._0_8_ = b_05;
              auVar61 = vpunpcklqdq_avx(auVar57,auVar62);
              auVar53 = ZEXT116(0) * auVar61 + ZEXT116(1) * auVar59;
              auVar54 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar61;
              auVar58._8_8_ = 0;
              auVar58._0_8_ = palVar27;
              auVar63._8_8_ = 0;
              auVar63._0_8_ = palVar28;
              auVar59 = vpunpcklqdq_avx(auVar58,auVar63);
              auVar64._8_8_ = 0;
              auVar64._0_8_ = local_228;
              auVar65._8_8_ = 0;
              auVar65._0_8_ = palVar29;
              auVar61 = vpunpcklqdq_avx(auVar64,auVar65);
              auVar59 = ZEXT116(0) * auVar61 + ZEXT116(1) * auVar59;
              auVar61 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar61;
              auVar50._0_8_ = -(ulong)(auVar42._0_8_ == 0);
              auVar50._8_8_ = -(ulong)(auVar42._8_8_ == 0);
              auVar50._16_8_ = -(ulong)(auVar45._0_8_ == 0);
              auVar50._24_8_ = -(ulong)(auVar45._8_8_ == 0);
              auVar47._0_8_ = -(ulong)(auVar46._0_8_ == 0);
              auVar47._8_8_ = -(ulong)(auVar46._8_8_ == 0);
              auVar47._16_8_ = -(ulong)(auVar52._0_8_ == 0);
              auVar47._24_8_ = -(ulong)(auVar52._8_8_ == 0);
              auVar50 = vpackssdw_avx2(auVar50,auVar47);
              auVar47 = vpermq_avx2(auVar50,0xd8);
              auVar48._0_8_ = -(ulong)(auVar53._0_8_ == 0);
              auVar48._8_8_ = -(ulong)(auVar53._8_8_ == 0);
              auVar48._16_8_ = -(ulong)(auVar54._0_8_ == 0);
              auVar48._24_8_ = -(ulong)(auVar54._8_8_ == 0);
              auVar49._0_8_ = -(ulong)(auVar59._0_8_ == 0);
              auVar49._8_8_ = -(ulong)(auVar59._8_8_ == 0);
              auVar49._16_8_ = -(ulong)(auVar61._0_8_ == 0);
              auVar49._24_8_ = -(ulong)(auVar61._8_8_ == 0);
              auVar50 = vpackssdw_avx2(auVar48,auVar49);
              auVar50 = vpermq_avx2(auVar50,0xd8);
              auVar50 = vpackssdw_avx2(auVar47,auVar50);
              if ((((((((((((((((auVar50 >> 0xf & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                               (auVar50 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                              && (auVar50 >> 0x2f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && (auVar50 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                            && (auVar50 >> 0x4f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                           && (auVar50 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar50 >> 0x6f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar50 >> 0x7f,0) == '\0') &&
                        (auVar50 >> 0x8f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       (auVar50 >> 0x9f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar50 >> 0xaf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar50 >> 0xbf,0) == '\0') &&
                    (auVar50 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   (auVar50 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar50 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  -1 < auVar50[0x1f]) {
                local_1b8._0_8_ = palVar29;
                alVar1[1]._0_4_ = in_stack_fffffffffffffda0;
                alVar1[0] = (longlong)palVar25;
                alVar1[1]._4_4_ = in_stack_fffffffffffffda4;
                alVar1[2] = (longlong)palVar28;
                alVar1[3] = (longlong)palVar27;
                parasail_memset___m256i(b,alVar1,uVar33);
                alVar2[1]._0_4_ = in_stack_fffffffffffffda0;
                alVar2[0] = (longlong)palVar25;
                alVar2[1]._4_4_ = in_stack_fffffffffffffda4;
                alVar2[2] = (longlong)palVar28;
                alVar2[3] = (longlong)palVar27;
                parasail_memset___m256i(b_00,alVar2,uVar33);
                alVar3[1]._0_4_ = in_stack_fffffffffffffda0;
                alVar3[0] = (longlong)palVar25;
                alVar3[1]._4_4_ = in_stack_fffffffffffffda4;
                alVar3[2] = (longlong)palVar28;
                alVar3[3] = (longlong)palVar27;
                parasail_memset___m256i(b_01,alVar3,uVar33);
                alVar4[1]._0_4_ = in_stack_fffffffffffffda0;
                alVar4[0] = (longlong)palVar25;
                alVar4[1]._4_4_ = in_stack_fffffffffffffda4;
                alVar4[2] = (longlong)palVar28;
                alVar4[3] = (longlong)palVar27;
                parasail_memset___m256i(palVar25,alVar4,uVar33);
                c[1]._0_4_ = in_stack_fffffffffffffda0;
                c[0] = (longlong)palVar25;
                c[1]._4_4_ = in_stack_fffffffffffffda4;
                c[2] = (longlong)palVar28;
                c[3] = (longlong)palVar27;
                parasail_memset___m256i(b_02,c,uVar33);
                c_00[1]._0_4_ = in_stack_fffffffffffffda0;
                c_00[0] = (longlong)palVar25;
                c_00[1]._4_4_ = in_stack_fffffffffffffda4;
                c_00[2] = (longlong)palVar28;
                c_00[3] = (longlong)palVar27;
                parasail_memset___m256i(b_03,c_00,uVar33);
                c_01[1]._0_4_ = in_stack_fffffffffffffda0;
                c_01[0] = (longlong)palVar25;
                c_01[1]._4_4_ = in_stack_fffffffffffffda4;
                c_01[2] = (longlong)palVar28;
                c_01[3] = (longlong)palVar27;
                parasail_memset___m256i(b_04,c_01,uVar33);
                c_02[1]._0_4_ = in_stack_fffffffffffffda0;
                c_02[0] = (longlong)palVar25;
                c_02[1]._4_4_ = in_stack_fffffffffffffda4;
                c_02[2] = (longlong)palVar28;
                c_02[3] = (longlong)palVar27;
                parasail_memset___m256i(b_05,c_02,uVar33);
                uVar30 = 0;
                uVar19 = (uint)uVar33;
                uVar32 = uVar19 - 1;
                iVar39 = -0x40000000;
                auVar44 = vpcmpeqd_avx2(auVar44,auVar44);
                auVar71 = ZEXT3264(auVar44);
                local_210 = 0;
                auVar68 = ZEXT1664((undefined1  [16])0x0);
                auVar51 = ZEXT1664((undefined1  [16])0x0);
                auVar67 = ZEXT1664((undefined1  [16])0x0);
                while( true ) {
                  palVar41 = b;
                  palVar37 = b_01;
                  palVar34 = b_00;
                  palVar29 = palVar25;
                  local_158 = auVar67._0_32_;
                  iVar35 = (int)uVar30;
                  if (local_210 == iVar8 + 1U) break;
                  auVar49 = auVar51._0_32_;
                  local_178 = auVar68._0_32_;
                  alVar1 = palVar41[uVar32];
                  alVar2 = palVar34[uVar32];
                  alVar3 = palVar37[uVar32];
                  alVar4 = palVar29[uVar32];
                  auVar44 = vperm2i128_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar1,0x28);
                  auVar44 = vpalignr_avx2((undefined1  [32])alVar1,auVar44,0xc);
                  auVar50 = vperm2i128_avx2((undefined1  [32])alVar2,(undefined1  [32])alVar2,0x28);
                  auVar50 = vpalignr_avx2((undefined1  [32])alVar2,auVar50,0xc);
                  auVar47 = vperm2i128_avx2((undefined1  [32])alVar3,(undefined1  [32])alVar3,0x28);
                  auVar47 = vpalignr_avx2((undefined1  [32])alVar3,auVar47,0xc);
                  auVar48 = vperm2i128_avx2((undefined1  [32])alVar4,(undefined1  [32])alVar4,0x28);
                  auVar48 = vpalignr_avx2((undefined1  [32])alVar4,auVar48,0xc);
                  lVar38 = (long)(int)(ppVar9->mapper[(byte)s2[local_210]] * uVar19) * 0x20;
                  iVar22 = (int)local_210 + -2;
                  b = local_238;
                  b_01 = local_248;
                  local_230 = (__m256i *)local_1b8._0_8_;
                  palVar25 = palVar26;
                  b_00 = local_240;
                  if (iVar35 == iVar22) {
                    b = palVar27;
                    b_01 = local_228;
                    local_230 = palVar26;
                    palVar25 = (__m256i *)local_1b8._0_8_;
                    b_00 = palVar28;
                  }
                  auVar51 = ZEXT1664((undefined1  [16])0x0);
                  lVar36 = 0;
                  auVar68 = ZEXT1664(ZEXT816(0) << 0x40);
                  auVar70 = ZEXT1664((undefined1  [16])0x0);
                  auVar13._8_8_ = 0x100000001;
                  auVar13._0_8_ = 0x100000001;
                  auVar13._16_8_ = 0x100000001;
                  auVar13._24_8_ = 0x100000001;
                  while( true ) {
                    auVar67 = ZEXT3264(local_158);
                    auVar43 = auVar68._0_32_;
                    auVar60 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
                    if (uVar33 << 5 == lVar36) break;
                    auVar69 = *(undefined1 (*) [32])((long)*b_02 + lVar36);
                    auVar5 = *(undefined1 (*) [32])((long)*b_03 + lVar36);
                    auVar6 = *(undefined1 (*) [32])((long)*b_04 + lVar36);
                    auVar7 = *(undefined1 (*) [32])((long)*b_05 + lVar36);
                    auVar44 = vpaddd_avx2(auVar44,*(undefined1 (*) [32])
                                                   ((long)pvVar10 + lVar36 + lVar38));
                    auVar44 = vpmaxsd_avx2(auVar44,auVar60);
                    auVar60 = vpmaxsd_avx2(auVar44,auVar69);
                    auVar66 = auVar51._0_32_;
                    auVar18 = vpmaxsd_avx2(auVar60,auVar66);
                    *(undefined1 (*) [32])((long)*b + lVar36) = auVar18;
                    auVar15 = vpcmpeqd_avx2(auVar18,auVar44);
                    auVar17 = vpcmpgtd_avx2(auVar60,auVar66);
                    local_1b8 = auVar70._0_32_;
                    auVar44 = vblendvps_avx(auVar43,auVar5,auVar17);
                    auVar50 = vpaddd_avx2(auVar50,*(undefined1 (*) [32])
                                                   ((long)pvVar11 + lVar36 + lVar38));
                    auVar44 = vblendvps_avx(auVar44,auVar50,auVar15);
                    auVar16 = vpcmpeqd_avx2(auVar18,ZEXT1632(ZEXT816(0) << 0x40));
                    auVar60 = vpandn_avx2(auVar16,auVar44);
                    *(undefined1 (*) [32])((long)*b_00 + lVar36) = auVar60;
                    auVar44 = vblendvps_avx(local_1b8,auVar6,auVar17);
                    auVar50 = vpaddd_avx2(auVar47,*(undefined1 (*) [32])
                                                   ((long)pvVar12 + lVar36 + lVar38));
                    auVar44 = vblendvps_avx(auVar44,auVar50,auVar15);
                    auVar14 = vpandn_avx2(auVar16,auVar44);
                    *(undefined1 (*) [32])((long)*b_01 + lVar36) = auVar14;
                    auVar44 = vblendvps_avx(auVar13,auVar7,auVar17);
                    auVar50 = vpcmpeqd_avx2(auVar50,auVar50);
                    auVar50 = vpsubd_avx2(auVar48,auVar50);
                    auVar48 = vpcmpeqd_avx2(auVar13,auVar13);
                    auVar44 = vblendvps_avx(auVar44,auVar50,auVar15);
                    auVar47 = vpandn_avx2(auVar16,auVar44);
                    *(undefined1 (*) [32])((long)*palVar25 + lVar36) = auVar47;
                    auVar50 = vpmaxsd_avx2(local_158,auVar60);
                    auVar15 = vpmaxsd_avx2(auVar14,auVar47);
                    auVar16._4_4_ = open;
                    auVar16._0_4_ = open;
                    auVar16._8_4_ = open;
                    auVar16._12_4_ = open;
                    auVar16._16_4_ = open;
                    auVar16._20_4_ = open;
                    auVar16._24_4_ = open;
                    auVar16._28_4_ = open;
                    auVar16 = vpsubd_avx2(auVar18,auVar16);
                    auVar20._4_4_ = gap;
                    auVar20._0_4_ = gap;
                    auVar20._8_4_ = gap;
                    auVar20._12_4_ = gap;
                    auVar20._16_4_ = gap;
                    auVar20._20_4_ = gap;
                    auVar20._24_4_ = gap;
                    auVar20._28_4_ = gap;
                    auVar17 = vpsubd_avx2(auVar69,auVar20);
                    auVar69 = vpcmpgtd_avx2(auVar16,auVar17);
                    auVar44 = vblendvps_avx(auVar5,auVar60,auVar69);
                    local_158 = vpmaxsd_avx2(auVar50,auVar15);
                    auVar50 = vblendvps_avx(auVar6,auVar14,auVar69);
                    auVar5 = vpsubd_avx2(auVar7,auVar48);
                    auVar7 = vpsubd_avx2(auVar47,auVar48);
                    auVar47 = vblendvps_avx(auVar5,auVar7,auVar69);
                    auVar69 = vpmaxsd_avx2(auVar16,auVar17);
                    *(undefined1 (*) [32])((long)*b_02 + lVar36) = auVar69;
                    *(undefined1 (*) [32])((long)*b_03 + lVar36) = auVar44;
                    *(undefined1 (*) [32])((long)*b_04 + lVar36) = auVar50;
                    *(undefined1 (*) [32])((long)*b_05 + lVar36) = auVar47;
                    local_178 = vpmaxsd_avx2(auVar18,local_178);
                    auVar50 = vpsubd_avx2(auVar66,auVar20);
                    auVar44 = vpmaxsd_avx2(auVar16,auVar50);
                    auVar51 = ZEXT3264(auVar44);
                    auVar50 = vpcmpgtd_avx2(auVar16,auVar50);
                    auVar44 = vblendvps_avx(auVar43,auVar60,auVar50);
                    auVar68 = ZEXT3264(auVar44);
                    auVar44 = vblendvps_avx(local_1b8,auVar14,auVar50);
                    auVar70 = ZEXT3264(auVar44);
                    auVar44 = vpcmpeqd_avx2(auVar6,auVar6);
                    auVar71 = ZEXT3264(auVar44);
                    auVar44 = vpsubd_avx2(auVar13,auVar48);
                    auVar13 = vblendvps_avx(auVar44,auVar7,auVar50);
                    auVar44 = *(undefined1 (*) [32])((long)*palVar41 + lVar36);
                    auVar50 = *(undefined1 (*) [32])((long)*palVar34 + lVar36);
                    auVar47 = *(undefined1 (*) [32])((long)*palVar37 + lVar36);
                    auVar48 = *(undefined1 (*) [32])((long)*palVar29 + lVar36);
                    lVar36 = lVar36 + 0x20;
                  }
                  if (iVar35 == iVar22) {
                    palVar27 = local_238;
                    palVar28 = local_240;
                    local_228 = local_248;
                  }
                  auVar68 = ZEXT3264(local_178);
                  for (iVar22 = 0; iVar22 != 8; iVar22 = iVar22 + 1) {
                    alVar1 = palVar41[uVar32];
                    auVar44 = vperm2i128_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar1,0x28
                                             );
                    auVar44 = vpalignr_avx2((undefined1  [32])alVar1,auVar44,0xc);
                    auVar47 = vpmovsxbd_avx2(ZEXT816(0x605040302010000));
                    auVar50 = vpermd_avx2(auVar47,auVar51._0_32_);
                    auVar48 = vpblendd_avx2(auVar50,ZEXT432((uint)-open),1);
                    auVar50 = vperm2i128_avx2(auVar43,auVar43,0x28);
                    auVar43 = vpalignr_avx2(auVar43,auVar50,0xc);
                    auVar69 = auVar70._0_32_;
                    auVar50 = vperm2i128_avx2(auVar69,auVar69,0x28);
                    auVar50 = vpalignr_avx2(auVar69,auVar50,0xc);
                    auVar47 = vpermd_avx2(auVar47,auVar13);
                    auVar13 = vpblendd_avx2(auVar47,ZEXT432(1),1);
                    lVar36 = 0;
                    while( true ) {
                      auVar51 = ZEXT3264(auVar48);
                      auVar70 = ZEXT3264(auVar50);
                      if (uVar33 << 5 == lVar36) break;
                      auVar44 = vpaddd_avx2(auVar44,*(undefined1 (*) [32])
                                                     ((long)pvVar10 + lVar36 + lVar38));
                      auVar47 = vpmaxsd_avx2(auVar44,auVar60);
                      auVar44 = *(undefined1 (*) [32])((long)*b + lVar36);
                      auVar5 = vpmaxsd_avx2(auVar44,auVar48);
                      *(undefined1 (*) [32])((long)*b + lVar36) = auVar5;
                      auVar47 = vpcmpeqd_avx2(auVar5,auVar47);
                      auVar44 = vpcmpgtd_avx2(auVar44,auVar48);
                      auVar69 = vpor_avx2(auVar47,auVar44);
                      auVar44 = vblendvps_avx(auVar43,*(undefined1 (*) [32])((long)*b_00 + lVar36),
                                              auVar69);
                      *(undefined1 (*) [32])((long)*b_00 + lVar36) = auVar44;
                      auVar47 = vblendvps_avx(auVar50,*(undefined1 (*) [32])((long)*b_01 + lVar36),
                                              auVar69);
                      *(undefined1 (*) [32])((long)*b_01 + lVar36) = auVar47;
                      auVar69 = vblendvps_avx(auVar13,*(undefined1 (*) [32])
                                                       ((long)*palVar25 + lVar36),auVar69);
                      *(undefined1 (*) [32])((long)*palVar25 + lVar36) = auVar69;
                      auVar6 = vpmaxsd_avx2(auVar67._0_32_,auVar44);
                      auVar7 = vpmaxsd_avx2(auVar47,auVar69);
                      auVar6 = vpmaxsd_avx2(auVar6,auVar7);
                      auVar67 = ZEXT3264(auVar6);
                      auVar6 = vpmaxsd_avx2(auVar5,auVar68._0_32_);
                      auVar68 = ZEXT3264(auVar6);
                      auVar6._4_4_ = open;
                      auVar6._0_4_ = open;
                      auVar6._8_4_ = open;
                      auVar6._12_4_ = open;
                      auVar6._16_4_ = open;
                      auVar6._20_4_ = open;
                      auVar6._24_4_ = open;
                      auVar6._28_4_ = open;
                      auVar14 = vpsubd_avx2(auVar5,auVar6);
                      auVar5._4_4_ = gap;
                      auVar5._0_4_ = gap;
                      auVar5._8_4_ = gap;
                      auVar5._12_4_ = gap;
                      auVar5._16_4_ = gap;
                      auVar5._20_4_ = gap;
                      auVar5._24_4_ = gap;
                      auVar5._28_4_ = gap;
                      auVar48 = vpsubd_avx2(auVar48,auVar5);
                      auVar6 = vpcmpgtd_avx2(auVar48,auVar14);
                      auVar5 = vpcmpeqd_avx2(auVar14,auVar48);
                      auVar7 = vpcmpgtd_avx2(auVar48,auVar60);
                      auVar5 = vpand_avx2(auVar5,auVar7);
                      auVar5 = vpor_avx2(auVar5,auVar6);
                      if ((((((((auVar5 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                               (auVar5 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                              (auVar5 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                             SUB321(auVar5 >> 0x7f,0) == '\0') &&
                            (auVar5 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(auVar5 >> 0xbf,0) == '\0') &&
                          (auVar5 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < auVar5[0x1f]) goto LAB_007433ca;
                      auVar5 = vpcmpgtd_avx2(auVar14,auVar48);
                      auVar43 = vblendvps_avx(auVar43,auVar44,auVar5);
                      auVar50 = vblendvps_avx(auVar50,auVar47,auVar5);
                      auVar44 = vblendvps_avx(auVar13,auVar69,auVar5);
                      auVar13 = vpsubd_avx2(auVar44,auVar71._0_32_);
                      auVar44 = *(undefined1 (*) [32])((long)*palVar41 + lVar36);
                      lVar36 = lVar36 + 0x20;
                    }
                  }
LAB_007433ca:
                  local_158 = auVar67._0_32_;
                  auVar50 = auVar68._0_32_;
                  auVar44 = vpcmpgtd_avx2(auVar50,auVar49);
                  palVar26 = palVar29;
                  local_248 = palVar37;
                  local_240 = palVar34;
                  local_238 = palVar41;
                  if ((((((((auVar44 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar44 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar44 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar44 >> 0x7f,0) != '\0') ||
                        (auVar44 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar44 >> 0xbf,0) != '\0') ||
                      (auVar44 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar44[0x1f] < '\0') {
                    auVar44 = vpermq_avx2(auVar50,0x44);
                    auVar44 = vpmaxsd_avx2(auVar50,auVar44);
                    auVar50 = vpslldq_avx2(auVar44,8);
                    auVar44 = vpmaxsd_avx2(auVar44,auVar50);
                    auVar50 = vpslldq_avx2(auVar44,4);
                    auVar44 = vpmaxsd_avx2(auVar44,auVar50);
                    iVar39 = auVar44._28_4_;
                    if (0x7ffffffe - iVar23 < iVar39) {
                      *(byte *)&result_00->flag = (byte)result_00->flag | 0x40;
                      palVar29 = palVar25;
                      goto LAB_007434f9;
                    }
                    auVar43._8_4_ = 7;
                    auVar43._0_8_ = 0x700000007;
                    auVar43._12_4_ = 7;
                    auVar43._16_4_ = 7;
                    auVar43._20_4_ = 7;
                    auVar43._24_4_ = 7;
                    auVar43._28_4_ = 7;
                    auVar49 = vpermd_avx2(auVar43,auVar44);
                    uVar30 = local_210 & 0xffffffff;
                  }
                  auVar51 = ZEXT3264(auVar49);
                  local_210 = local_210 + 1;
                  local_1b8._0_8_ = local_230;
                }
                local_210 = (ulong)(iVar8 + 1U);
                local_230 = (__m256i *)local_1b8._0_8_;
                b_00 = palVar34;
                b_01 = palVar37;
                b = palVar41;
LAB_007434f9:
                palVar25 = local_248;
                if ((iVar39 == 0x7fffffff) ||
                   (auVar44._8_4_ = 0x7fffffff, auVar44._0_8_ = 0x7fffffff7fffffff,
                   auVar44._12_4_ = 0x7fffffff, auVar44._16_4_ = 0x7fffffff,
                   auVar44._20_4_ = 0x7fffffff, auVar44._24_4_ = 0x7fffffff,
                   auVar44._28_4_ = 0x7fffffff, auVar44 = vpcmpeqd_avx2(local_158,auVar44),
                   (((((((auVar44 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                        (auVar44 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar44 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      SUB321(auVar44 >> 0x7f,0) != '\0') ||
                     (auVar44 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    SUB321(auVar44 >> 0xbf,0) != '\0') ||
                   (auVar44 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   auVar44[0x1f] < '\0')) {
                  *(byte *)&result_00->flag = (byte)result_00->flag | 0x40;
                }
                iVar23 = parasail_result_is_saturated(result_00);
                local_158._0_4_ = 0;
                palVar34 = palVar26;
                if (iVar23 == 0) {
                  palVar37 = b;
                  local_220 = b_00;
                  palVar41 = palVar28;
                  ptr = local_228;
                  ptr_00 = palVar27;
                  local_1b8._0_8_ = palVar29;
                  if (iVar35 != (int)local_210 + -1) {
                    if (iVar35 == (int)local_210 + -2) {
                      local_248 = local_228;
                      palVar34 = local_230;
                      local_230 = palVar29;
                      palVar37 = local_238;
                      local_220 = local_240;
                      palVar41 = b_00;
                      ptr = b_01;
                      b_01 = palVar25;
                      ptr_00 = b;
                      local_240 = palVar28;
                      local_238 = palVar27;
                      local_1b8._0_8_ = palVar26;
                    }
                    else {
                      local_1b8._0_8_ = local_230;
                      local_230 = palVar29;
                      palVar37 = palVar27;
                      local_220 = palVar28;
                      palVar41 = b_00;
                      ptr = b_01;
                      b_01 = local_228;
                      ptr_00 = b;
                    }
                  }
                  local_158._0_4_ = -0x40000000;
                  uVar33 = 0;
                  iVar22 = -0x40000000;
                  iVar23 = -0x40000000;
                  while( true ) {
                    iVar40 = (int)uVar24;
                    palVar29 = local_230;
                    if ((uVar19 & 0xfffffff) << 3 == (uint)uVar33) break;
                    if ((*(int *)((long)*palVar37 + uVar33 * 4) == iVar39) &&
                       (uVar32 = ((uint)uVar33 & 7) * uVar19 + ((uint)(uVar33 >> 3) & 0x1fffffff),
                       (int)uVar32 < iVar40)) {
                      iVar23 = *(int *)((long)*local_220 + uVar33 * 4);
                      local_158._0_4_ = *(int *)((long)*b_01 + uVar33 * 4);
                      iVar22 = *(int *)((long)(longlong *)local_1b8._0_8_ + uVar33 * 4);
                      uVar24 = (ulong)uVar32;
                    }
                    uVar33 = uVar33 + 1;
                  }
                }
                else {
                  iVar22 = 0;
                  iVar23 = 0;
                  iVar39 = 0;
                  iVar35 = 0;
                  iVar40 = 0;
                  local_1b8._0_8_ = local_230;
                  palVar41 = b_00;
                  ptr = b_01;
                  b_01 = local_228;
                  ptr_00 = b;
                  local_220 = palVar28;
                  palVar37 = palVar27;
                }
                result_00->score = iVar39;
                result_00->end_query = iVar40;
                result_00->end_ref = iVar35;
                ((result_00->field_4).stats)->matches = iVar23;
                ((result_00->field_4).stats)->similar = local_158._0_4_;
                ((result_00->field_4).stats)->length = iVar22;
                parasail_free((void *)local_1b8._0_8_);
                parasail_free(b_01);
                parasail_free(local_220);
                parasail_free(palVar37);
                parasail_free(b_05);
                parasail_free(b_04);
                parasail_free(b_03);
                parasail_free(b_02);
                parasail_free(palVar34);
                parasail_free(palVar29);
                parasail_free(local_248);
                parasail_free(ptr);
                parasail_free(local_240);
                parasail_free(palVar41);
                parasail_free(local_238);
                parasail_free(ptr_00);
              }
              else {
                result_00 = (parasail_result_t *)0x0;
              }
            }
            goto LAB_00743876;
          }
          __format = "%s: %s must be >= 0\n";
          pcVar31 = "gap";
        }
      }
    }
  }
  result_00 = (parasail_result_t *)0x0;
  fprintf(_stderr,__format,"parasail_sw_stats_striped_profile_avx2_256_32_internal",pcVar31);
LAB_00743876:
  parasail_profile_free(profile_00);
  parasail_result_free(result);
  result_00->end_query = iVar21;
  result_00->end_ref = iVar8;
  return result_00;
}

Assistant:

parasail_result_t* INAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    const char *s1 = profile->s1;
    const parasail_matrix_t *matrix = profile->matrix;

    /* find the end loc first with the faster implementation */
    parasail_result_t *result = parasail_sw_striped_profile_avx2_256_32(profile, s2, s2Len, open, gap);
    if (!parasail_result_is_saturated(result)) {
#if 0
        int s1Len_new = 0;
        int s2Len_new = 0;
        char *s1_new = NULL;
        char *s2_new = NULL;
        parasail_profile_t *profile_new = NULL;
        parasail_result_t *result_new = NULL;
        int s1_begin = 0;
        int s2_begin = 0;
        int s1Len_final = 0;
        int s2Len_final = 0;
        parasail_profile_t *profile_final = NULL;
        parasail_result_t *result_final = NULL;

        /* using the end loc and the non-stats version of the function,
         * reverse the inputs and find the beg loc */
        s1Len_new = result->end_query+1;
        s2Len_new = result->end_ref+1;
        s1_new = parasail_reverse(s1, s1Len_new);
        s2_new = parasail_reverse(s2, s2Len_new);
        profile_new = parasail_profile_create_avx_256_32(
                s1_new, s1Len_new, matrix);
        profile_new->stop = result->score;
        result_new = parasail_sw_striped_profile_avx2_256_32(
                profile_new, s2_new, s2Len_new, open, gap);

        /* using both the beg and end loc, call the original stats func */
        s1_begin = s1Len_new - result_new->end_query - 1;
        s2_begin = s2Len_new - result_new->end_ref - 1;
        s1Len_final = s1Len_new - s1_begin;
        s2Len_final = s2Len_new - s2_begin;
        assert(s1_begin >= 0);
        assert(s2_begin >= 0);
        assert(s1Len_new > s1_begin);
        assert(s2Len_new > s2_begin);
        profile_final = parasail_profile_create_stats_avx_256_32(
                &s1[s1_begin], s1Len_final, matrix);
        result_final = PNAME(
                profile_final, &s2[s2_begin], s2Len_final, open, gap);

        /* clean up all the temporary profiles, sequences, and results */
        free(s1_new);
        free(s2_new);
        parasail_profile_free(profile_new);
        parasail_profile_free(profile_final);
        parasail_result_free(result);
        parasail_result_free(result_new);

        /* correct the end locations before returning */
        result_final->end_query = s1Len_new-1;
        result_final->end_ref = s2Len_new-1;
        return result_final;
#else
        int s1Len_new = 0;
        int s2Len_new = 0;
        parasail_profile_t *profile_final = NULL;
        parasail_result_t *result_final = NULL;

        /* using the end loc, call the original stats function */
        s1Len_new = result->end_query+1;
        s2Len_new = result->end_ref+1;
        profile_final = parasail_profile_create_stats_avx_256_32(
                s1, s1Len_new, matrix);
        result_final = PNAME(
                profile_final, s2, s2Len_new, open, gap);

        /* clean up all the temporary profiles, sequences, and results */
        parasail_profile_free(profile_final);
        parasail_result_free(result);

        /* correct the end locations before returning */
        result_final->end_query = s1Len_new-1;
        result_final->end_ref = s2Len_new-1;
        return result_final;
#endif
    }
    else {
        return result;
    }
}